

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall ON_ModelComponent::SetId(ON_ModelComponent *this,ON_UUID *component_id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  bool bContentChange;
  uint bit;
  ON_UUID *component_id_local;
  ON_ModelComponent *this_local;
  
  if ((this->m_locked_status & 8) == 0) {
    bVar3 = ::operator==(&this->m_component_id,component_id);
    uVar1 = component_id->Data2;
    uVar2 = component_id->Data3;
    (this->m_component_id).Data1 = component_id->Data1;
    (this->m_component_id).Data2 = uVar1;
    (this->m_component_id).Data3 = uVar2;
    *(undefined8 *)(this->m_component_id).Data4 = *(undefined8 *)component_id->Data4;
    this->m_set_status = this->m_set_status | 8;
    if (!bVar3) {
      IncrementContentVersionNumber(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ModelComponent::SetId(
  const ON_UUID& component_id
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::IdAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (false == (m_component_id == component_id));
  m_component_id = component_id;
  m_set_status |= bit;
  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}